

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O3

string * __thiscall
google::protobuf::util::converter::ProtoWriter::ProtoElement::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ProtoElement *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *buffer;
  byte bVar2;
  string *psVar3;
  pointer pcVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _Alloc_hider _Var6;
  Field *pFVar7;
  bool bVar8;
  AlphaNum local_168;
  AlphaNum local_138;
  AlphaNum local_108;
  string local_d8;
  undefined1 auStack_b8 [8];
  stack<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::deque<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>_>
  element_stack;
  undefined1 local_60 [8];
  string name;
  ProtoElement *local_38;
  ProtoElement *now;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>();
  element_stack.c.
  super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  element_stack.c.
  super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  element_stack.c.
  super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  element_stack.c.
  super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  element_stack.c.
  super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  element_stack.c.
  super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  element_stack.c.
  super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  element_stack.c.
  super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_b8 = (undefined1  [8])0x0;
  element_stack.c.
  super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_38 = this;
  std::
  _Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
  ::_M_initialize_map((_Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
                       *)auStack_b8,0);
  while( true ) {
    iVar5 = (*(this->super_BaseElement)._vptr_BaseElement[2])(this);
    if (CONCAT44(extraout_var,iVar5) == 0) break;
    if ((_Elt_pointer)
        element_stack.c.
        super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node ==
        element_stack.c.
        super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first + -1) {
      std::
      deque<google::protobuf::util::converter::ProtoWriter::ProtoElement_const*,std::allocator<google::protobuf::util::converter::ProtoWriter::ProtoElement_const*>>
      ::_M_push_back_aux<google::protobuf::util::converter::ProtoWriter::ProtoElement_const*const&>
                ((deque<google::protobuf::util::converter::ProtoWriter::ProtoElement_const*,std::allocator<google::protobuf::util::converter::ProtoWriter::ProtoElement_const*>>
                  *)auStack_b8,&local_38);
    }
    else {
      *element_stack.c.
       super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node = (ProtoElement **)local_38;
      element_stack.c.
      super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node =
           element_stack.c.
           super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    iVar5 = (*(local_38->super_BaseElement)._vptr_BaseElement[2])();
    this = (ProtoElement *)CONCAT44(extraout_var_00,iVar5);
    local_38 = this;
  }
  name.field_2._8_8_ = paVar1;
  if (element_stack.c.
      super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node !=
      (_Map_pointer)
      element_stack.c.
      super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    buffer = local_138.digits;
    do {
      if ((_Elt_pointer)
          element_stack.c.
          super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node ==
          element_stack.c.
          super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
        local_38 = (ProtoElement *)
                   element_stack.c.
                   super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_last[-1][3].super_BaseElement.
                   _vptr_BaseElement;
        operator_delete(element_stack.c.
                        super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur);
        element_stack.c.
        super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur =
             (_Elt_pointer)
             element_stack.c.
             super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_last[-1];
        element_stack.c.
        super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first =
             (_Elt_pointer)
             &(((ProtoElement *)
               ((long)element_stack.c.
                      super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur + 0x1f8))->super_BaseElement)
              .parent_;
        element_stack.c.
        super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node =
             (_Map_pointer)
             ((long)element_stack.c.
                    super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur + 0x1f8);
        element_stack.c.
        super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last =
             element_stack.c.
             super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_last + -1;
      }
      else {
        local_38 = (ProtoElement *)
                   element_stack.c.
                   super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node[-1];
        element_stack.c.
        super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node =
             element_stack.c.
             super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node + -1;
      }
      pFVar7 = local_38->parent_field_;
      if (pFVar7->cardinality_ == 3) {
        iVar5 = (*(local_38->super_BaseElement)._vptr_BaseElement[2])();
        pFVar7 = local_38->parent_field_;
        if (*(Field **)(CONCAT44(extraout_var_01,iVar5) + 0x28) != pFVar7) goto LAB_00311680;
      }
      else {
LAB_00311680:
        psVar3 = (pFVar7->name_).ptr_;
        pcVar4 = (psVar3->_M_dataplus)._M_p;
        local_60 = (undefined1  [8])&name._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_60,pcVar4,pcVar4 + psVar3->_M_string_length);
        if (name._M_dataplus._M_p == (pointer)0x0) {
LAB_0031173d:
          local_108.piece_data_ = "[\"";
          local_108.piece_size_ = 2;
          CEscape(&local_d8,(string *)local_60);
          local_138.piece_data_ = local_d8._M_dataplus._M_p;
          local_138.piece_size_ = local_d8._M_string_length;
          local_168.piece_data_ = "\"]";
          local_168.piece_size_ = 2;
          StrAppend(__return_storage_ptr__,&local_108,&local_138,&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
        }
        else {
          _Var6._M_p = (pointer)0x0;
          do {
            bVar2 = *(byte *)((long)local_60 + (long)_Var6._M_p);
            if (((bVar2 != 0x5f) && (9 < (byte)(bVar2 - 0x30))) &&
               (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) {
              bVar8 = _Var6._M_p != (pointer)0x0;
              goto LAB_003116e3;
            }
            _Var6._M_p = _Var6._M_p + 1;
          } while (name._M_dataplus._M_p != _Var6._M_p);
          bVar8 = true;
          _Var6 = name._M_dataplus;
LAB_003116e3:
          if ((bool)(bVar8 ^ 1U | name._M_dataplus._M_p != _Var6._M_p)) goto LAB_0031173d;
          if (__return_storage_ptr__->_M_string_length == 0) {
            std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
          }
          else {
            local_108.piece_data_ = ".";
            local_108.piece_size_ = 1;
            local_138.piece_data_ = (char *)local_60;
            local_138.piece_size_ = (size_t)name._M_dataplus._M_p;
            StrAppend(__return_storage_ptr__,&local_108,&local_138);
          }
        }
        if (local_60 != (undefined1  [8])&name._M_string_length) {
          operator_delete((void *)local_60);
        }
        pFVar7 = local_38->parent_field_;
      }
      if ((pFVar7->cardinality_ == 3) && (0 < local_38->array_index_)) {
        local_108.piece_data_ = "[";
        local_108.piece_size_ = 1;
        local_138.piece_data_ = buffer;
        local_138.piece_size_ = (size_t)FastInt32ToBufferLeft(local_38->array_index_ + -1,buffer);
        local_138.piece_size_ = local_138.piece_size_ + -(long)buffer;
        local_168.piece_data_ = "]";
        local_168.piece_size_ = 1;
        StrAppend(__return_storage_ptr__,&local_108,&local_138,&local_168);
      }
    } while (element_stack.c.
             super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node !=
             (_Map_pointer)
             element_stack.c.
             super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
             ._M_impl.super__Deque_impl_data._M_map_size);
  }
  std::
  _Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
  ::~_Deque_base((_Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
                  *)auStack_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string ProtoWriter::ProtoElement::ToString() const {
  std::string loc = "";

  // first populate a stack with the nodes since we need to process them
  // from root to leaf when generating the string location
  const ProtoWriter::ProtoElement* now = this;
  std::stack<const ProtoWriter::ProtoElement*> element_stack;
  while (now->parent() != nullptr) {
    element_stack.push(now);
    now = now->parent();
  }

  // now pop each node from the stack and append to the location string
  while (!element_stack.empty()) {
    now = element_stack.top();
    element_stack.pop();

    if (!ow_->IsRepeated(*(now->parent_field_)) ||
        now->parent()->parent_field_ != now->parent_field_) {
      std::string name = now->parent_field_->name();
      int i = 0;
      while (i < name.size() && (ascii_isalnum(name[i]) || name[i] == '_')) ++i;
      if (i > 0 && i == name.size()) {  // safe field name
        if (loc.empty()) {
          loc = name;
        } else {
          StrAppend(&loc, ".", name);
        }
      } else {
        StrAppend(&loc, "[\"", CEscape(name), "\"]");
      }
    }

    int array_index_now = now->array_index_;
    if (ow_->IsRepeated(*(now->parent_field_)) && array_index_now > 0) {
      StrAppend(&loc, "[", array_index_now - 1, "]");
    }
  }

  return loc;
}